

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int decode(jpeg *j,huffman *h)

{
  uint uVar1;
  int iVar2;
  int local_2c;
  int k;
  int c;
  uint temp;
  huffman *h_local;
  jpeg *j_local;
  
  if (j->code_bits < 0x10) {
    grow_buffer_unsafe(j);
  }
  uVar1 = (uint)h->fast[(int)(j->code_buffer >> ((char)j->code_bits - 9U & 0x1f) & 0x1ff)];
  if (uVar1 < 0xff) {
    if (j->code_bits < (int)(uint)h->size[(int)uVar1]) {
      j_local._4_4_ = 0xffffffff;
    }
    else {
      j->code_bits = j->code_bits - (uint)h->size[(int)uVar1];
      j_local._4_4_ = (uint)h->values[(int)uVar1];
    }
  }
  else {
    if (j->code_bits < 0x10) {
      uVar1 = j->code_buffer << (0x10U - (char)j->code_bits & 0x1f);
    }
    else {
      uVar1 = j->code_buffer >> ((char)j->code_bits - 0x10U & 0x1f);
    }
    k = uVar1 & 0xffff;
    for (local_2c = 10; h->maxcode[local_2c] <= (uint)k; local_2c = local_2c + 1) {
    }
    if (local_2c == 0x11) {
      j->code_bits = j->code_bits + -0x10;
      j_local._4_4_ = 0xffffffff;
    }
    else if (j->code_bits < local_2c) {
      j_local._4_4_ = 0xffffffff;
    }
    else {
      iVar2 = (j->code_buffer >> ((char)j->code_bits - (char)local_2c & 0x1fU) & bmask[local_2c]) +
              h->delta[local_2c];
      if ((j->code_buffer >> ((char)j->code_bits - h->size[iVar2] & 0x1f) & bmask[h->size[iVar2]])
          != (uint)h->code[iVar2]) {
        __assert_fail("(((j->code_buffer) >> (j->code_bits - h->size[c])) & bmask[h->size[c]]) == h->code[c]"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                      ,0x2e7,"int decode(jpeg *, huffman *)");
      }
      j->code_bits = j->code_bits - local_2c;
      j_local._4_4_ = (uint)h->values[iVar2];
    }
  }
  return j_local._4_4_;
}

Assistant:

__forceinline static int decode(jpeg *j, huffman *h)
{
   unsigned int temp;
   int c,k;

   if (j->code_bits < 16) grow_buffer_unsafe(j);

   // look at the top FAST_BITS and determine what symbol ID it is,
   // if the code is <= FAST_BITS
   c = (j->code_buffer >> (j->code_bits - FAST_BITS)) & ((1 << FAST_BITS)-1);
   k = h->fast[c];
   if (k < 255) {
      if (h->size[k] > j->code_bits)
         return -1;
      j->code_bits -= h->size[k];
      return h->values[k];
   }

   // naive test is to shift the code_buffer down so k bits are
   // valid, then test against maxcode. To speed this up, we've
   // preshifted maxcode left so that it has (16-k) 0s at the
   // end; in other words, regardless of the number of bits, it
   // wants to be compared against something shifted to have 16;
   // that way we don't need to shift inside the loop.
   if (j->code_bits < 16)
      temp = (j->code_buffer << (16 - j->code_bits)) & 0xffff;
   else
      temp = (j->code_buffer >> (j->code_bits - 16)) & 0xffff;
   for (k=FAST_BITS+1 ; ; ++k)
      if (temp < h->maxcode[k])
         break;
   if (k == 17) {
      // error! code not found
      j->code_bits -= 16;
      return -1;
   }

   if (k > j->code_bits)
      return -1;

   // convert the huffman code to the symbol id
   c = ((j->code_buffer >> (j->code_bits - k)) & bmask[k]) + h->delta[k];
   assert((((j->code_buffer) >> (j->code_bits - h->size[c])) & bmask[h->size[c]]) == h->code[c]);

   // convert the id to a symbol
   j->code_bits -= k;
   return h->values[c];
}